

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

bool __thiscall draco::PlyReader::ParseElement(PlyReader *this,DecoderBuffer *buffer)

{
  pointer pPVar1;
  pointer pPVar2;
  undefined8 uVar3;
  bool bVar4;
  longlong num_entries;
  mapped_type *pmVar5;
  PlyReader *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string element_name;
  string line;
  DecoderBuffer line_buffer;
  string count_str;
  
  line_buffer.bit_mode_ = buffer->bit_mode_;
  line_buffer._49_1_ = buffer->field_0x31;
  line_buffer.bitstream_version_ = buffer->bitstream_version_;
  line_buffer._52_4_ = *(undefined4 *)&buffer->field_0x34;
  line_buffer.data_ = buffer->data_;
  line_buffer.data_size_ = buffer->data_size_;
  line_buffer.pos_ = buffer->pos_;
  line_buffer.bit_decoder_.bit_buffer_ = (buffer->bit_decoder_).bit_buffer_;
  line_buffer.bit_decoder_.bit_buffer_end_ = (buffer->bit_decoder_).bit_buffer_end_;
  line_buffer.bit_decoder_.bit_offset_ = (buffer->bit_decoder_).bit_offset_;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = (PlyReader *)&line;
  parser::ParseLine(&line_buffer,(string *)this_00);
  element_name._M_dataplus._M_p = (pointer)&element_name.field_2;
  element_name._M_string_length = 0;
  element_name.field_2._M_local_buf[0] = '\0';
  SplitWords(&words,this_00,&line);
  if (0x40 < (ulong)((long)words.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)words.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    bVar4 = std::operator==(words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"element");
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&element_name);
      std::__cxx11::string::string
                ((string *)&count_str,
                 (string *)
                 (words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      num_entries = strtoll(count_str._M_dataplus._M_p,(char **)0x0,10);
      std::__cxx11::string::~string((string *)&count_str);
      pPVar1 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar2 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->element_index_,&element_name);
      *pmVar5 = (mapped_type)(((long)pPVar2 - (long)pPVar1) / 0x70);
      PlyElement::PlyElement((PlyElement *)&count_str,&element_name,num_entries);
      std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::
      emplace_back<draco::PlyElement>(&this->elements_,(PlyElement *)&count_str);
      PlyElement::~PlyElement((PlyElement *)&count_str);
      uVar3 = line_buffer._48_8_;
      buffer->bit_mode_ = line_buffer.bit_mode_;
      buffer->field_0x31 = line_buffer._49_1_;
      buffer->bitstream_version_ = line_buffer.bitstream_version_;
      (buffer->bit_decoder_).bit_buffer_end_ = line_buffer.bit_decoder_.bit_buffer_end_;
      (buffer->bit_decoder_).bit_offset_ = line_buffer.bit_decoder_.bit_offset_;
      buffer->pos_ = line_buffer.pos_;
      (buffer->bit_decoder_).bit_buffer_ = line_buffer.bit_decoder_.bit_buffer_;
      buffer->data_ = line_buffer.data_;
      buffer->data_size_ = line_buffer.data_size_;
      bVar4 = true;
      line_buffer._48_8_ = uVar3;
      goto LAB_001163aa;
    }
  }
  bVar4 = false;
LAB_001163aa:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&element_name);
  std::__cxx11::string::~string((string *)&line);
  DecoderBuffer::BitDecoder::~BitDecoder(&line_buffer.bit_decoder_);
  return bVar4;
}

Assistant:

bool PlyReader::ParseElement(DecoderBuffer *buffer) {
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string element_name;
  int64_t count;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "element") {
    element_name = words[1];
    const std::string count_str = words[2];
    count = strtoll(count_str.c_str(), nullptr, 10);
  } else {
    return false;
  }
  element_index_[element_name] = static_cast<uint32_t>(elements_.size());
  elements_.emplace_back(PlyElement(element_name, count));
  *buffer = line_buffer;
  return true;
}